

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedMemoryDependentInvocation::Run
          (AdvancedMemoryDependentInvocation *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  int w;
  int h;
  Vector<float,_4> local_48;
  undefined1 local_38 [8];
  vec4 zero;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedMemoryDependentInvocation *this_local;
  
  bVar1 = ShaderImageLoadStoreBase::SupportedInVS(&this->super_ShaderImageLoadStoreBase,2);
  if (bVar1) {
    zero.m_data._8_8_ = anon_var_dwarf_25a729;
    GVar2 = ShaderImageLoadStoreBase::BuildProgram
                      (&this->super_ShaderImageLoadStoreBase,
                       "#version 420 core\nlayout(location = 0) in vec4 i_position;\nlayout(location = 1) in vec4 i_color;\nout vec4 vs_color;\nlayout(rgba32f) coherent uniform imageBuffer g_buffer;\nlayout(rgba32f) coherent uniform image2D g_image;\nvoid main() {\n  gl_Position = i_position;\n  vs_color = i_color;\n  imageStore(g_buffer, 0, vec4(1.0));\n  imageStore(g_image, ivec2(0, 0), vec4(2.0));\n  memoryBarrier();\n}"
                       ,(char *)0x0,(char *)0x0,(char *)0x0,
                       "#version 420 core\nin vec4 vs_color;\nlayout(location = 0) out vec4 o_color;\nlayout(rgba32f) coherent uniform imageBuffer g_buffer;\nlayout(rgba32f) coherent uniform image2D g_image;\nvoid main() {\n  o_color = vs_color;\n  if (imageLoad(g_buffer, 0) != vec4(1.0)) o_color = vec4(1.0, 0.0, 0.0, 0.1);\n  if (imageLoad(g_image, ivec2(0, 0)) != vec4(2.0)) o_color = vec4(1.0, 0.0, 0.0, 0.2);\n}"
                       ,(bool *)0x0);
    this->m_program = GVar2;
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,this->m_program,"g_buffer");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,0);
    GVar3 = glu::CallLogWrapper::glGetUniformLocation
                      (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,this->m_program,"g_image");
    glu::CallLogWrapper::glUniform1i
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,GVar3,1);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_38,0.0);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_buffer);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x10,local_38,0x88e4);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glGenTextures
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_buffer_tex);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,this->m_buffer_tex);
    glu::CallLogWrapper::glTexBuffer
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0x8814,this->m_buffer);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8c2a,0);
    glu::CallLogWrapper::glGenTextures
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_texture);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,this->m_texture);
    glu::CallLogWrapper::glTexParameteri
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexImage2D
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0,0x8814,1,1,0,0x1908,0x1406,local_38);
    glu::CallLogWrapper::glBindTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0xde1,0);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,this->m_buffer_tex,0,'\0',0,0x88ba,0x8814);
    glu::CallLogWrapper::glBindImageTexture
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,this->m_texture,0,'\0',0,0x88ba,0x8814);
    ShaderImageLoadStoreBase::CreateFullViewportQuad
              (&this->super_ShaderImageLoadStoreBase,&this->m_vao,&this->m_vbo,(GLuint *)0x0);
    glu::CallLogWrapper::glClear
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x4000);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_vao);
    glu::CallLogWrapper::glDrawArraysInstancedBaseInstance
              (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,5,0,4,1,0);
    w = ShaderImageLoadStoreBase::getWindowWidth(&this->super_ShaderImageLoadStoreBase);
    h = ShaderImageLoadStoreBase::getWindowHeight(&this->super_ShaderImageLoadStoreBase);
    tcu::Vector<float,_4>::Vector(&local_48,0.0,1.0,0.0,1.0);
    bVar1 = ShaderImageLoadStoreBase::ValidateReadBuffer
                      (&this->super_ShaderImageLoadStoreBase,0,0,w,h,&local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local = (AdvancedMemoryDependentInvocation *)0x0;
    }
    else {
      this_local = (AdvancedMemoryDependentInvocation *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedMemoryDependentInvocation *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(2))
			return NOT_SUPPORTED;
		const char* const glsl_vs =
			"#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL
			"layout(location = 1) in vec4 i_color;" NL "out vec4 vs_color;" NL
			"layout(rgba32f) coherent uniform imageBuffer g_buffer;" NL
			"layout(rgba32f) coherent uniform image2D g_image;" NL "void main() {" NL "  gl_Position = i_position;" NL
			"  vs_color = i_color;" NL "  imageStore(g_buffer, 0, vec4(1.0));" NL
			"  imageStore(g_image, ivec2(0, 0), vec4(2.0));" NL "  memoryBarrier();" NL "}";
		const char* const glsl_fs =
			"#version 420 core" NL "in vec4 vs_color;" NL "layout(location = 0) out vec4 o_color;" NL
			"layout(rgba32f) coherent uniform imageBuffer g_buffer;" NL
			"layout(rgba32f) coherent uniform image2D g_image;" NL "void main() {" NL "  o_color = vs_color;" NL
			"  if (imageLoad(g_buffer, 0) != vec4(1.0)) o_color = vec4(1.0, 0.0, 0.0, 0.1);" NL
			"  if (imageLoad(g_image, ivec2(0, 0)) != vec4(2.0)) o_color = vec4(1.0, 0.0, 0.0, 0.2);" NL "}";
		m_program = BuildProgram(glsl_vs, NULL, NULL, NULL, glsl_fs);
		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_buffer"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_image"), 1);

		vec4 zero(0);
		glGenBuffers(1, &m_buffer);
		glBindBuffer(GL_TEXTURE_BUFFER, m_buffer);
		glBufferData(GL_TEXTURE_BUFFER, sizeof(vec4), &zero, GL_STATIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);

		glGenTextures(1, &m_buffer_tex);
		glBindTexture(GL_TEXTURE_BUFFER, m_buffer_tex);
		glTexBuffer(GL_TEXTURE_BUFFER, GL_RGBA32F, m_buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, 1, 1, 0, GL_RGBA, GL_FLOAT, &zero);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_buffer_tex, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);
		glBindImageTexture(1, m_texture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_RGBA32F);

		CreateFullViewportQuad(&m_vao, &m_vbo, NULL);

		glClear(GL_COLOR_BUFFER_BIT);
		glBindVertexArray(m_vao);
		glDrawArraysInstancedBaseInstance(GL_TRIANGLE_STRIP, 0, 4, 1, 0);

		if (!ValidateReadBuffer(0, 0, getWindowWidth(), getWindowHeight(), vec4(0, 1, 0, 1)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}